

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void * ImLoadFileToMemory(char *filename,char *file_open_mode,int *out_file_size,int padding_bytes)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  FILE *__stream;
  long lVar4;
  void *__ptr;
  size_t sVar5;
  size_t __n;
  
  if ((filename == (char *)0x0) || (file_open_mode == (char *)0x0)) {
    __assert_fail("filename && file_open_mode",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x4f5,"void *ImLoadFileToMemory(const char *, const char *, int *, int)");
  }
  if (out_file_size != (int *)0x0) {
    *out_file_size = 0;
  }
  __stream = fopen(filename,file_open_mode);
  if (__stream != (FILE *)0x0) {
    iVar3 = fseek(__stream,0,2);
    if (((iVar3 == 0) && (lVar4 = ftell(__stream), lVar4 != -1)) &&
       (iVar3 = fseek(__stream,0,0), pIVar2 = GImGui, iVar3 == 0)) {
      iVar3 = (int)lVar4;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __ptr = (*(pIVar2->IO).MemAllocFn)((long)(padding_bytes + iVar3));
      if (__ptr != (void *)0x0) {
        __n = (size_t)iVar3;
        sVar5 = fread(__ptr,1,__n,__stream);
        if (sVar5 != __n) {
          fclose(__stream);
          pIVar2 = GImGui;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
          (*(pIVar2->IO).MemFreeFn)(__ptr);
          return (void *)0x0;
        }
        if (0 < padding_bytes) {
          memset((void *)((long)__ptr + __n),0,(ulong)(uint)padding_bytes);
        }
        fclose(__stream);
        if (out_file_size != (int *)0x0) {
          *out_file_size = iVar3;
          return __ptr;
        }
        return __ptr;
      }
    }
    fclose(__stream);
  }
  return (void *)0x0;
}

Assistant:

void* ImLoadFileToMemory(const char* filename, const char* file_open_mode, int* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && file_open_mode);
    if (out_file_size)
        *out_file_size = 0;

    FILE* f;
    if ((f = fopen(filename, file_open_mode)) == NULL)
        return NULL;

    long file_size_signed;
    if (fseek(f, 0, SEEK_END) || (file_size_signed = ftell(f)) == -1 || fseek(f, 0, SEEK_SET))
    {
        fclose(f);
        return NULL;
    }

    int file_size = (int)file_size_signed;
    void* file_data = ImGui::MemAlloc(file_size + padding_bytes);
    if (file_data == NULL)
    {
        fclose(f);
        return NULL;
    }
    if (fread(file_data, 1, (size_t)file_size, f) != (size_t)file_size)
    {
        fclose(f);
        ImGui::MemFree(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void *)(((char*)file_data) + file_size), 0, padding_bytes);

    fclose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}